

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O2

void xxHash64_test(void *key,int len,uint32_t seed,void *out)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  lVar7 = (long)len;
  uVar10 = (ulong)seed;
  if ((uint)len < 0x20) {
    uVar10 = uVar10 + 0x27d4eb2f165667c5 + lVar7;
    switch(len & 0x1f) {
    case 0:
      goto switchD_001088b4_caseD_0;
    case 2:
      goto switchD_001088b4_caseD_2;
    case 3:
      goto switchD_001088b4_caseD_3;
    case 4:
      goto switchD_001088b4_caseD_4;
    case 5:
      goto switchD_001088b4_caseD_5;
    case 6:
      goto switchD_001088b4_caseD_6;
    case 7:
      goto switchD_001088b4_caseD_7;
    case 8:
      goto switchD_001088b4_caseD_8;
    case 9:
      goto switchD_001088b4_caseD_9;
    case 10:
      goto switchD_001088b4_caseD_a;
    case 0xb:
      goto switchD_001088b4_caseD_b;
    case 0xc:
      goto switchD_001088b4_caseD_c;
    case 0xd:
      goto switchD_001088b4_caseD_d;
    case 0xe:
      goto switchD_001088b4_caseD_e;
    case 0xf:
      goto switchD_001088b4_caseD_f;
    case 0x10:
      goto switchD_001088b4_caseD_10;
    case 0x11:
      goto switchD_001088b4_caseD_11;
    case 0x12:
      goto switchD_001088b4_caseD_12;
    case 0x13:
      goto switchD_001088b4_caseD_13;
    case 0x14:
      goto switchD_001088b4_caseD_14;
    case 0x15:
      goto switchD_001088b4_caseD_15;
    case 0x16:
      goto switchD_001088b4_caseD_16;
    case 0x17:
      goto switchD_001088b4_caseD_17;
    case 0x18:
      goto switchD_001088b4_caseD_18;
    case 0x19:
      goto switchD_001088b4_caseD_19;
    case 0x1a:
      goto switchD_001088b4_caseD_1a;
    case 0x1b:
      goto switchD_001088b4_caseD_1b;
    case 0x1c:
      goto switchD_001088b4_caseD_1c;
    case 0x1d:
      goto switchD_001088b4_caseD_1d;
    case 0x1e:
      goto switchD_001088b4_caseD_1e;
    case 0x1f:
      goto switchD_001088b4_caseD_1f;
    }
  }
  else {
    puVar2 = (uint *)((long)key + lVar7 + -0x20);
    uVar5 = uVar10 + 0xc2b2ae3d27d4eb4f;
    uVar8 = uVar10 + 0x60ea27eeadc0b5d6;
    uVar12 = uVar10 + 0x61c8864e7a143579;
    do {
      uVar10 = *(long *)((long)key + 0x10) * -0x3d4d51c2d82b14b1 + uVar10;
      uVar8 = *key * -0x3d4d51c2d82b14b1 + uVar8;
      uVar5 = *(long *)((long)key + 8) * -0x3d4d51c2d82b14b1 + uVar5;
      uVar9 = uVar10 >> 0x21 | uVar10 * 0x80000000;
      puVar1 = (uint *)((long)key + 0x18);
      uVar4 = uVar8 >> 0x21 | uVar8 * 0x80000000;
      uVar6 = uVar5 >> 0x21 | uVar5 * 0x80000000;
      key = (void *)((long)key + 0x20);
      uVar8 = uVar4 * -0x61c8864e7a143579;
      uVar5 = uVar6 * -0x61c8864e7a143579;
      uVar10 = uVar9 * -0x61c8864e7a143579;
      uVar12 = *(long *)puVar1 * -0x3d4d51c2d82b14b1 + uVar12;
      uVar11 = uVar12 >> 0x21 | uVar12 * 0x80000000;
      uVar12 = uVar11 * -0x61c8864e7a143579;
    } while (key <= puVar2);
    uVar10 = ((uVar11 * -0x210ca4fef0869357 >> 0x21 | uVar11 * -0x784349ab80000000) *
              -0x61c8864e7a143579 ^
             ((uVar9 * -0x210ca4fef0869357 >> 0x21 | uVar9 * -0x784349ab80000000) *
              -0x61c8864e7a143579 ^
             ((uVar6 * -0x210ca4fef0869357 >> 0x21 | uVar6 * -0x784349ab80000000) *
              -0x61c8864e7a143579 ^
             ((uVar4 * -0x210ca4fef0869357 >> 0x21 | uVar4 * -0x784349ab80000000) *
              -0x61c8864e7a143579 ^
             (uVar12 >> 0x2e | uVar11 * -0x1939e850d5e40000) +
             (uVar10 >> 0x34 | uVar9 * 0x779b185ebca87000) +
             (uVar5 >> 0x39 | uVar6 * 0x1bbcd8c2f5e54380) +
             (uVar8 >> 0x3f | uVar4 * 0x3c6ef3630bd7950e)) * -0x61c8864e7a143579 +
             0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
             0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + lVar7 + -0x7a1435883d4d519d;
    switch(len & 0x1f) {
    case 0:
      goto switchD_001088b4_caseD_0;
    case 1:
      break;
    case 3:
switchD_001088b4_caseD_3:
      uVar3 = *key;
      key = (void *)((long)key + 1);
      uVar10 = (ulong)(byte)uVar3 * 0x27d4eb2f165667c5 ^ uVar10;
      uVar10 = (uVar10 >> 0x35 | uVar10 << 0xb) * -0x61c8864e7a143579;
    case 2:
switchD_001088b4_caseD_2:
      uVar3 = *key;
      key = (void *)((long)key + 1);
      uVar10 = (ulong)(byte)uVar3 * 0x27d4eb2f165667c5 ^ uVar10;
      uVar10 = (uVar10 >> 0x35 | uVar10 << 0xb) * -0x61c8864e7a143579;
      break;
    case 4:
      goto switchD_001088b4_caseD_4;
    case 5:
      goto switchD_001088b4_caseD_5;
    case 6:
      goto switchD_001088b4_caseD_6;
    case 7:
      goto switchD_001088b4_caseD_7;
    case 8:
      goto switchD_001088b4_caseD_8;
    case 9:
      goto switchD_001088b4_caseD_9;
    case 10:
      goto switchD_001088b4_caseD_a;
    case 0xb:
      goto switchD_001088b4_caseD_b;
    case 0xc:
      goto switchD_001088b4_caseD_c;
    case 0xd:
      goto switchD_001088b4_caseD_d;
    case 0xe:
      goto switchD_001088b4_caseD_e;
    case 0xf:
      goto switchD_001088b4_caseD_f;
    case 0x18:
switchD_001088b4_caseD_18:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x10:
switchD_001088b4_caseD_10:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_001088b4_caseD_8;
    case 0x19:
switchD_001088b4_caseD_19:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x11:
switchD_001088b4_caseD_11:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_001088b4_caseD_9;
    case 0x1a:
switchD_001088b4_caseD_1a:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x12:
switchD_001088b4_caseD_12:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_001088b4_caseD_a;
    case 0x1b:
switchD_001088b4_caseD_1b:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x13:
switchD_001088b4_caseD_13:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_001088b4_caseD_b;
    case 0x1c:
switchD_001088b4_caseD_1c:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x14:
switchD_001088b4_caseD_14:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_001088b4_caseD_c;
    case 0x1d:
switchD_001088b4_caseD_1d:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x15:
switchD_001088b4_caseD_15:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_001088b4_caseD_d;
    case 0x1e:
switchD_001088b4_caseD_1e:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x16:
switchD_001088b4_caseD_16:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_001088b4_caseD_e;
    case 0x1f:
switchD_001088b4_caseD_1f:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    case 0x17:
switchD_001088b4_caseD_17:
      lVar7 = *key;
      key = (void *)((long)key + 8);
      uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
               -0x61c8864e7a143579 ^ uVar10;
      uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      goto switchD_001088b4_caseD_f;
    }
  }
  uVar10 = (ulong)(byte)*key * 0x27d4eb2f165667c5 ^ uVar10;
  uVar10 = uVar10 >> 0x35 | uVar10 << 0xb;
  goto LAB_00108d64;
switchD_001088b4_caseD_f:
  lVar7 = *key;
  key = (void *)((long)key + 8);
  uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
           -0x61c8864e7a143579 ^ uVar10;
  uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  goto switchD_001088b4_caseD_7;
switchD_001088b4_caseD_e:
  lVar7 = *key;
  key = (void *)((long)key + 8);
  uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
           -0x61c8864e7a143579 ^ uVar10;
  uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  goto switchD_001088b4_caseD_6;
switchD_001088b4_caseD_d:
  lVar7 = *key;
  key = (void *)((long)key + 8);
  uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
           -0x61c8864e7a143579 ^ uVar10;
  uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  goto switchD_001088b4_caseD_5;
switchD_001088b4_caseD_c:
  lVar7 = *key;
  key = (void *)((long)key + 8);
  uVar10 = ((ulong)(lVar7 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar7 * -0x6c158a5880000000) *
           -0x61c8864e7a143579 ^ uVar10;
  uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  goto switchD_001088b4_caseD_4;
switchD_001088b4_caseD_b:
  uVar10 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
           -0x61c8864e7a143579 ^ uVar10;
  uVar10 = (ulong)(byte)*(uint *)((long)key + 8) * 0x27d4eb2f165667c5 ^
           (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  uVar10 = (ulong)*(byte *)((long)key + 9) * 0x27d4eb2f165667c5 ^
           (uVar10 >> 0x35 | uVar10 << 0xb) * -0x61c8864e7a143579;
  uVar10 = uVar10 >> 0x35 | uVar10 << 0xb;
  uVar5 = (ulong)*(byte *)((long)key + 10);
  goto LAB_00108d53;
switchD_001088b4_caseD_a:
  uVar10 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
           -0x61c8864e7a143579 ^ uVar10;
  uVar10 = (ulong)(byte)*(uint *)((long)key + 8) * 0x27d4eb2f165667c5 ^
           (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  uVar10 = uVar10 >> 0x35 | uVar10 << 0xb;
  uVar5 = (ulong)*(byte *)((long)key + 9);
LAB_00108d53:
  uVar10 = uVar10 * -0x61c8864e7a143579;
  goto LAB_00108d57;
switchD_001088b4_caseD_9:
  uVar10 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
           -0x61c8864e7a143579 ^ uVar10;
  uVar5 = (ulong)(byte)*(uint *)((long)key + 8);
  uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
LAB_00108d57:
  uVar10 = uVar5 * 0x27d4eb2f165667c5 ^ uVar10;
  uVar10 = uVar10 >> 0x35 | uVar10 << 0xb;
LAB_00108d64:
  uVar10 = uVar10 * -0x61c8864e7a143579;
  goto switchD_001088b4_caseD_0;
switchD_001088b4_caseD_7:
  uVar3 = *key;
  key = (void *)((long)key + 4);
  uVar10 = (ulong)uVar3 * -0x61c8864e7a143579 ^ uVar10;
  uVar10 = (uVar10 >> 0x29 | uVar10 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  goto switchD_001088b4_caseD_3;
switchD_001088b4_caseD_6:
  uVar10 = (ulong)*key * -0x61c8864e7a143579 ^ uVar10;
  uVar10 = (ulong)(byte)*(uint *)((long)key + 4) * 0x27d4eb2f165667c5 ^
           (uVar10 >> 0x29 | uVar10 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  uVar10 = uVar10 >> 0x35 | uVar10 << 0xb;
  uVar5 = (ulong)*(byte *)((long)key + 5);
  goto LAB_00108d53;
switchD_001088b4_caseD_5:
  uVar10 = (ulong)*key * -0x61c8864e7a143579 ^ uVar10;
  uVar5 = (ulong)(byte)*(uint *)((long)key + 4);
  uVar10 = (uVar10 >> 0x29 | uVar10 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  goto LAB_00108d57;
switchD_001088b4_caseD_4:
  uVar10 = (ulong)*key * -0x61c8864e7a143579 ^ uVar10;
  uVar10 = (uVar10 >> 0x29 | uVar10 << 0x17) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  goto switchD_001088b4_caseD_0;
switchD_001088b4_caseD_8:
  uVar10 = ((ulong)(*key * -0x3d4d51c2d82b14b1) >> 0x21 | *key * -0x6c158a5880000000) *
           -0x61c8864e7a143579 ^ uVar10;
  uVar10 = (uVar10 >> 0x25 | uVar10 << 0x1b) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
switchD_001088b4_caseD_0:
  uVar10 = (uVar10 >> 0x21 ^ uVar10) * -0x3d4d51c2d82b14b1;
  uVar10 = (uVar10 >> 0x1d ^ uVar10) * 0x165667b19e3779f9;
  *(ulong *)out = uVar10 >> 0x20 ^ uVar10;
  return;
}

Assistant:

inline void xxHash64_test( const void * key, int len, uint32_t seed, void * out ) {
  // objsize 630-7fc + c10-1213: 1999
  *(uint64_t*)out = (uint64_t) XXH64(key, (size_t) len, (unsigned long long) seed);
}